

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall re2::Regexp::Walker<re2::Frag>::Walker(Walker<re2::Frag> *this)

{
  stack<re2::WalkState<re2::Frag>,std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>>
  *this_00;
  Walker<re2::Frag> *this_local;
  
  this->_vptr_Walker = (_func_int **)&PTR__Walker_001ac4b0;
  this_00 = (stack<re2::WalkState<re2::Frag>,std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>>
             *)operator_new(0x50);
  std::
  stack<re2::WalkState<re2::Frag>,std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>>
  ::stack<std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>,void>
            (this_00);
  this->stack_ = (stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
                  *)this_00;
  this->stopped_early_ = false;
  return;
}

Assistant:

Regexp::Walker<T>::Walker() {
  stack_ = new stack<WalkState<T> >;
  stopped_early_ = false;
}